

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlatformUtils.cpp
# Opt level: O0

XMLMsgLoader * xercesc_4_0::XMLPlatformUtils::loadAMsgSet(XMLCh *msgDomain)

{
  InMemMsgLoader *this;
  size_t in_RSI;
  OutOfMemoryException *anon_var_0;
  XMLMsgLoader *ms;
  XMLCh *msgDomain_local;
  
  this = (InMemMsgLoader *)XMemory::operator_new((XMemory *)0x10,in_RSI);
  InMemMsgLoader::InMemMsgLoader(this,msgDomain);
  return &this->super_XMLMsgLoader;
}

Assistant:

XMLMsgLoader* XMLPlatformUtils::loadAMsgSet(const XMLCh* const msgDomain)
{
    XMLMsgLoader* ms=0;

    try
    {
	#if defined (XERCES_USE_MSGLOADER_ICU)
		ms = new ICUMsgLoader(msgDomain);
	#elif defined (XERCES_USE_MSGLOADER_ICONV)
		ms = new MsgCatalogLoader(msgDomain);
	#elif defined (XERCES_USE_MSGLOADER_INMEMORY)
		ms = new InMemMsgLoader(msgDomain);
	#else
		#error No MsgLoader configured for platform! You must configure it.
	#endif
    }
    catch(const OutOfMemoryException&)
    {
        throw;
    }
    catch(...)
    {
        panic(PanicHandler::Panic_CantLoadMsgDomain);
    }

    return ms;
}